

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureCubeMapArrayImageTextureSize.cpp
# Opt level: O0

void __thiscall
glcts::TextureCubeMapArrayTextureSizeRTComputeShader::deleteTextures
          (TextureCubeMapArrayTextureSizeRTComputeShader *this)

{
  int iVar1;
  RenderContext *pRVar2;
  undefined4 extraout_var;
  Functions *gl;
  TextureCubeMapArrayTextureSizeRTComputeShader *this_local;
  long lVar3;
  
  pRVar2 = deqp::Context::getRenderContext
                     ((this->super_TextureCubeMapArrayTextureSizeRTBase).
                      super_TextureCubeMapArrayTextureSizeBase.super_TestCaseBase.m_context);
  iVar1 = (*pRVar2->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar1);
  (**(code **)(lVar3 + 8))(0x84c2);
  (**(code **)(lVar3 + 0xb8))(0x9009,0);
  if (this->m_to_img_id != 0) {
    (**(code **)(lVar3 + 0x480))(1,&this->m_to_img_id);
    this->m_to_img_id = 0;
  }
  TextureCubeMapArrayTextureSizeBase::deleteTextures((TextureCubeMapArrayTextureSizeBase *)this);
  return;
}

Assistant:

void TextureCubeMapArrayTextureSizeRTComputeShader::deleteTextures(void)
{
	/* Get Gl entry points */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Reset GLES state */
	gl.activeTexture(GL_TEXTURE2);
	gl.bindTexture(GL_TEXTURE_CUBE_MAP_ARRAY, 0);

	/* Delete GLES objects */
	if (m_to_img_id != 0)
	{
		gl.deleteTextures(1, &m_to_img_id);
		m_to_img_id = 0;
	}

	TextureCubeMapArrayTextureSizeRTBase::deleteTextures();
}